

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O1

lzma_ret lzma_decode(lzma_coder_conflict8 *coder,lzma_dict *dictptr,uint8_t *in,size_t *in_pos,
                    size_t in_size)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint8_t *__src;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  byte bVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  lzma_vli lVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  probability *ppVar26;
  lzma_ret lVar27;
  probability (*papVar28) [768];
  size_t sVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  lzma_lzma_state local_f0;
  uint local_ec;
  uint local_dc;
  ulong local_d8;
  ulong local_c0;
  uint local_ac;
  
  __src = dictptr->buf;
  uVar6 = dictptr->pos;
  local_d8 = dictptr->full;
  uVar32 = dictptr->limit;
  sVar7 = dictptr->size;
  uVar10 = (coder->rc).init_bytes_left;
  local_f0 = coder->state;
  uVar30 = (ulong)coder->rep0;
  uVar8 = coder->uncompressed_size;
  uVar21 = uVar8 + uVar6;
  if (uVar32 - uVar6 <= uVar8) {
    uVar21 = uVar32;
  }
  if (uVar8 == 0xffffffffffffffff) {
    uVar21 = uVar32;
  }
  local_dc = coder->rep1;
  local_ec = coder->rep2;
  local_ac = coder->rep3;
  uVar3 = coder->pos_mask;
  papVar28 = (probability (*) [768])coder->probs;
  uVar32 = (ulong)coder->symbol;
  uVar16 = coder->limit;
  uVar14 = coder->offset;
  uVar24 = (ulong)coder->len;
  uVar4 = coder->literal_pos_mask;
  uVar5 = coder->literal_context_bits;
  bVar35 = uVar10 == 0;
  if (!bVar35) {
    if (*in_pos == in_size) {
      return LZMA_OK;
    }
    uVar18 = (coder->rc).code;
    sVar29 = *in_pos;
    do {
      uVar18 = (uint)in[sVar29] | uVar18 << 8;
      sVar15 = sVar29 + 1;
      uVar11 = uVar10 - 1;
      bVar35 = uVar10 == 1;
      if (bVar35) break;
      bVar36 = in_size - 1 != sVar29;
      sVar29 = sVar15;
      uVar10 = uVar11;
    } while (bVar36);
    (coder->rc).code = uVar18;
    *in_pos = sVar15;
    (coder->rc).init_bytes_left = uVar11;
  }
  if (!bVar35) {
    return LZMA_OK;
  }
  uVar18 = (coder->rc).range;
  uVar13 = (coder->rc).code;
  uVar10 = (coder->rc).init_bytes_left;
  sVar29 = *in_pos;
  local_c0 = uVar6;
  if (coder->sequence < (SEQ_COPY|SEQ_BLOCK_HEADER)) {
    uVar12 = uVar3 & (uint)uVar6;
    uVar25 = uVar30;
    uVar34 = uVar32;
    uVar33 = uVar32;
    uVar19 = uVar13;
    uVar31 = uVar13;
    uVar23 = uVar14;
    switch(coder->sequence) {
    default:
switchD_005bc663_caseD_0:
      if ((uVar8 != 0xffffffffffffffff) && (local_c0 == uVar21)) break;
      uVar23 = uVar18;
      if (uVar18 < 0x1000000) {
        if (sVar29 == in_size) goto LAB_005bc6b5;
        pbVar1 = in + sVar29;
        sVar29 = sVar29 + 1;
        uVar13 = uVar13 << 8 | (uint)*pbVar1;
        uVar23 = uVar18 << 8;
      }
      ppVar26 = coder->is_match[local_f0] + uVar12;
      uVar2 = *ppVar26;
      uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
      uVar19 = uVar13 - uVar18;
      if (uVar13 < uVar18) {
        *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
        bVar9 = (byte)uVar5;
        sVar15 = 0;
        if (local_c0 == 0) {
          sVar15 = sVar7;
        }
        papVar28 = coder->literal +
                   (ulong)(__src[(sVar15 - 1) + local_c0] >> (8 - bVar9 & 0x1f)) +
                   ((ulong)((uint)local_c0 & uVar4) << (bVar9 & 0x3f));
        uVar32 = 1;
        if (local_f0 < STATE_LIT_MATCH) {
switchD_005bc663_caseD_2:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_BLOCK;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = uVar13 << 8 | (uint)*pbVar1;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar32];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar32 * 2;
          uVar33 = (ulong)uVar12;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar13;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
            uVar33 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_3:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_CODER_INIT;
              uVar32 = uVar33;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar19 = uVar19 << 8 | (uint)*pbVar1;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar33];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar33 * 2;
          uVar34 = (ulong)uVar12;
          uVar13 = uVar19 - uVar18;
          if (uVar19 < uVar18) {
            (*papVar28)[uVar33] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar19;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar33] = uVar2 - (uVar2 >> 5);
            uVar34 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_4:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_CODE;
              uVar32 = uVar34;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = uVar13 << 8 | (uint)*pbVar1;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar34];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar34 * 2;
          uVar32 = (ulong)uVar12;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            (*papVar28)[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar13;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar34] = uVar2 - (uVar2 >> 5);
            uVar32 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_5:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL3;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar19 = uVar19 << 8 | (uint)*pbVar1;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar32];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar32 * 2;
          uVar34 = (ulong)uVar12;
          uVar13 = uVar19 - uVar18;
          if (uVar19 < uVar18) {
            (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar19;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
            uVar34 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_6:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_CRC32;
              uVar32 = uVar34;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = uVar13 << 8 | (uint)*pbVar1;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar34];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar34 * 2;
          uVar32 = (ulong)uVar12;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            (*papVar28)[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar13;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar34] = uVar2 - (uVar2 >> 5);
            uVar32 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_7:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL5;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar32];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar32 * 2;
          uVar34 = (ulong)uVar12;
          uVar13 = uVar19 - uVar18;
          if (uVar19 < uVar18) {
            (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar19;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
            uVar34 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_8:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL6;
              uVar32 = uVar34;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = (uint)*pbVar1 | uVar13 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar34];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar34 * 2;
          uVar32 = (ulong)uVar12;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            (*papVar28)[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar13;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar34] = uVar2 - (uVar2 >> 5);
            uVar32 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_9:
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL7;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
          }
          uVar2 = (*papVar28)[uVar32];
          uVar23 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar32 * 2;
          uVar25 = (ulong)uVar13;
          if (uVar19 < uVar23) {
            (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar19;
            uVar18 = uVar23;
          }
          else {
            (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
            uVar25 = (ulong)(uVar13 | 1);
            uVar13 = uVar19 - uVar23;
            uVar18 = uVar18 - uVar23;
          }
        }
        else {
          sVar15 = 0;
          if (local_c0 <= uVar30) {
            sVar15 = sVar7;
          }
          uVar24 = (ulong)((uint)__src[sVar15 + ~uVar30 + local_c0] * 2);
          uVar14 = 0x100;
          uVar32 = 1;
switchD_005bc663_caseD_a:
          uVar23 = uVar14 & (uint)uVar24;
          uVar19 = uVar14 + (int)uVar32 + uVar23;
          uVar12 = uVar13;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED0;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar12 = (uint)*pbVar1 | uVar13 << 8;
          }
          uVar2 = (*papVar28)[uVar19];
          uVar17 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar32 * 2;
          uVar13 = uVar12 - uVar17;
          if (uVar12 < uVar17) {
            (*papVar28)[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar23 = uVar23 ^ uVar14;
            uVar13 = uVar12;
            uVar18 = uVar17;
          }
          else {
            uVar18 = uVar18 - uVar17;
            (*papVar28)[uVar19] = uVar2 - (uVar2 >> 5);
            uVar31 = uVar31 | 1;
          }
          uVar32 = (ulong)uVar31;
          uVar24 = (ulong)((uint)uVar24 * 2);
switchD_005bc663_caseD_b:
          uVar14 = uVar23 & (uint)uVar24;
          uVar19 = uVar23 + (int)uVar32 + uVar14;
          uVar12 = uVar13;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED1;
              uVar19 = uVar13;
              uVar14 = uVar23;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar12 = (uint)*pbVar1 | uVar13 << 8;
          }
          uVar2 = (*papVar28)[uVar19];
          uVar17 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar32 * 2;
          uVar13 = uVar12 - uVar17;
          if (uVar12 < uVar17) {
            (*papVar28)[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar14 = uVar14 ^ uVar23;
            uVar13 = uVar12;
            uVar18 = uVar17;
          }
          else {
            uVar18 = uVar18 - uVar17;
            (*papVar28)[uVar19] = uVar2 - (uVar2 >> 5);
            uVar31 = uVar31 | 1;
          }
          uVar32 = (ulong)uVar31;
          uVar24 = (ulong)((uint)uVar24 * 2);
switchD_005bc663_caseD_c:
          uVar23 = uVar14 & (uint)uVar24;
          uVar19 = uVar14 + (int)uVar32 + uVar23;
          uVar12 = uVar13;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED2;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar12 = (uint)*pbVar1 | uVar13 << 8;
          }
          uVar2 = (*papVar28)[uVar19];
          uVar17 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar32 * 2;
          uVar13 = uVar12 - uVar17;
          if (uVar12 < uVar17) {
            (*papVar28)[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar23 = uVar23 ^ uVar14;
            uVar13 = uVar12;
            uVar18 = uVar17;
          }
          else {
            uVar18 = uVar18 - uVar17;
            (*papVar28)[uVar19] = uVar2 - (uVar2 >> 5);
            uVar31 = uVar31 | 1;
          }
          uVar32 = (ulong)uVar31;
          uVar24 = (ulong)((uint)uVar24 * 2);
switchD_005bc663_caseD_d:
          uVar14 = uVar23 & (uint)uVar24;
          uVar19 = uVar23 + (int)uVar32 + uVar14;
          uVar12 = uVar13;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED3;
              uVar19 = uVar13;
              uVar14 = uVar23;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar12 = (uint)*pbVar1 | uVar13 << 8;
          }
          uVar2 = (*papVar28)[uVar19];
          uVar17 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar32 * 2;
          uVar13 = uVar12 - uVar17;
          if (uVar12 < uVar17) {
            (*papVar28)[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar14 = uVar14 ^ uVar23;
            uVar13 = uVar12;
            uVar18 = uVar17;
          }
          else {
            uVar18 = uVar18 - uVar17;
            (*papVar28)[uVar19] = uVar2 - (uVar2 >> 5);
            uVar31 = uVar31 | 1;
          }
          uVar32 = (ulong)uVar31;
          uVar24 = (ulong)((uint)uVar24 * 2);
switchD_005bc663_caseD_e:
          uVar23 = uVar14 & (uint)uVar24;
          uVar19 = uVar14 + (int)uVar32 + uVar23;
          uVar12 = uVar13;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED4;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar12 = (uint)*pbVar1 | uVar13 << 8;
          }
          uVar2 = (*papVar28)[uVar19];
          uVar17 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar32 * 2;
          uVar13 = uVar12 - uVar17;
          if (uVar12 < uVar17) {
            (*papVar28)[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar23 = uVar23 ^ uVar14;
            uVar13 = uVar12;
            uVar18 = uVar17;
          }
          else {
            uVar18 = uVar18 - uVar17;
            (*papVar28)[uVar19] = uVar2 - (uVar2 >> 5);
            uVar31 = uVar31 | 1;
          }
          uVar32 = (ulong)uVar31;
          uVar24 = (ulong)((uint)uVar24 * 2);
switchD_005bc663_caseD_f:
          uVar14 = uVar23 & (uint)uVar24;
          uVar19 = uVar23 + (int)uVar32 + uVar14;
          uVar12 = uVar13;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED5;
              uVar19 = uVar13;
              uVar14 = uVar23;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar12 = (uint)*pbVar1 | uVar13 << 8;
          }
          uVar2 = (*papVar28)[uVar19];
          uVar17 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar32 * 2;
          uVar13 = uVar12 - uVar17;
          if (uVar12 < uVar17) {
            (*papVar28)[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar14 = uVar14 ^ uVar23;
            uVar13 = uVar12;
            uVar18 = uVar17;
          }
          else {
            uVar18 = uVar18 - uVar17;
            (*papVar28)[uVar19] = uVar2 - (uVar2 >> 5);
            uVar31 = uVar31 | 1;
          }
          uVar32 = (ulong)uVar31;
          uVar24 = (ulong)((uint)uVar24 * 2);
switchD_005bc663_caseD_10:
          uVar23 = uVar14 & (uint)uVar24;
          uVar19 = uVar14 + (int)uVar32 + uVar23;
          uVar12 = uVar13;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED6;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar12 = (uint)*pbVar1 | uVar13 << 8;
          }
          uVar2 = (*papVar28)[uVar19];
          uVar17 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar32 * 2;
          uVar13 = uVar12 - uVar17;
          if (uVar12 < uVar17) {
            (*papVar28)[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar23 = uVar23 ^ uVar14;
            uVar13 = uVar12;
            uVar18 = uVar17;
          }
          else {
            uVar18 = uVar18 - uVar17;
            (*papVar28)[uVar19] = uVar2 - (uVar2 >> 5);
            uVar31 = uVar31 | 1;
          }
          uVar32 = (ulong)uVar31;
          uVar24 = (ulong)((uint)uVar24 * 2);
switchD_005bc663_caseD_11:
          uVar14 = uVar23 & (uint)uVar24;
          uVar19 = uVar23 + (int)uVar32 + uVar14;
          uVar12 = uVar13;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED7;
              uVar19 = uVar13;
              uVar14 = uVar23;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar12 = (uint)*pbVar1 | uVar13 << 8;
          }
          uVar2 = (*papVar28)[uVar19];
          uVar17 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar32 * 2;
          uVar25 = (ulong)uVar31;
          uVar13 = uVar12 - uVar17;
          if (uVar12 < uVar17) {
            (*papVar28)[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar14 = uVar14 ^ uVar23;
            uVar13 = uVar12;
            uVar18 = uVar17;
          }
          else {
            uVar18 = uVar18 - uVar17;
            (*papVar28)[uVar19] = uVar2 - (uVar2 >> 5);
            uVar25 = (ulong)(uVar31 | 1);
          }
        }
        local_f0 = lzma_decode::next_state[local_f0];
        uVar32 = uVar25;
switchD_005bc663_caseD_12:
        uVar25 = local_c0;
        if (local_c0 != uVar21) {
          uVar25 = local_c0 + 1;
          __src[local_c0] = (uint8_t)uVar32;
          if (local_d8 < uVar25) {
            local_d8 = uVar25;
          }
        }
        if (local_c0 == uVar21) {
          coder->sequence = SEQ_LITERAL_WRITE;
          uVar19 = uVar13;
          local_c0 = uVar25;
          goto LAB_005bf1a3;
        }
      }
      else {
        uVar18 = uVar23 - uVar18;
        *ppVar26 = uVar2 - (uVar2 >> 5);
switchD_005bc663_caseD_13:
        uVar23 = local_ec;
        uVar11 = (uint32_t)uVar32;
        uVar17 = (uint)uVar30;
        local_ec = local_dc;
        uVar31 = uVar18;
        uVar13 = uVar19;
        if (uVar18 < 0x1000000) {
          if (sVar29 == in_size) {
            coder->sequence = SEQ_IS_REP;
            lVar27 = LZMA_OK;
            bVar35 = true;
            local_ec = uVar23;
            goto LAB_005bf1a7;
          }
          pbVar1 = in + sVar29;
          sVar29 = sVar29 + 1;
          uVar31 = uVar18 << 8;
          uVar13 = (uint)*pbVar1 | uVar19 << 8;
        }
        uVar25 = (ulong)local_f0;
        uVar2 = coder->is_rep[uVar25];
        uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
        uVar19 = uVar13 - uVar18;
        if (uVar13 < uVar18) {
          coder->is_rep[uVar25] = (short)(0x800 - uVar2 >> 5) + uVar2;
          local_f0 = (uint)(STATE_SHORTREP_LIT < local_f0) * 3 + STATE_LIT_MATCH;
          uVar32 = 1;
          local_ac = uVar23;
          local_dc = uVar17;
switchD_005bc663_caseD_14:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_MATCH_LEN_CHOICE;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = (uint)*pbVar1 | uVar13 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (coder->match_len_decoder).choice;
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            (coder->match_len_decoder).choice = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_005bc663_caseD_15:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_MATCH_LEN_LOW0;
                uVar19 = uVar13;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar13 = (uint)*pbVar1 | uVar13 << 8;
              uVar23 = uVar18 << 8;
            }
            ppVar26 = (coder->match_len_decoder).low[uVar12] + uVar32;
            uVar2 = *ppVar26;
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar31 = (int)uVar32 * 2;
            uVar32 = (ulong)uVar31;
            uVar19 = uVar13 - uVar18;
            if (uVar13 < uVar18) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar13;
            }
            else {
              uVar18 = uVar23 - uVar18;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar32 = (ulong)(uVar31 | 1);
            }
switchD_005bc663_caseD_16:
            uVar13 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_MATCH_LEN_LOW1;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar13 = uVar18 << 8;
            }
            ppVar26 = (coder->match_len_decoder).low[uVar12] + uVar32;
            uVar2 = *ppVar26;
            uVar18 = (uVar13 >> 0xb) * (uint)uVar2;
            uVar23 = (int)uVar32 * 2;
            uVar32 = (ulong)uVar23;
            uVar31 = uVar19 - uVar18;
            if (uVar19 < uVar18) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar31 = uVar19;
            }
            else {
              uVar18 = uVar13 - uVar18;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar32 = (ulong)(uVar23 | 1);
            }
switchD_005bc663_caseD_17:
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_MATCH_LEN_LOW2;
                uVar19 = uVar31;
                goto LAB_005bf1a3;
              }
              uVar18 = uVar18 << 8;
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar31 = (uint)*pbVar1 | uVar31 << 8;
            }
            ppVar26 = (coder->match_len_decoder).low[uVar12] + uVar32;
            uVar2 = *ppVar26;
            uVar12 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar23 = (int)uVar32 * 2;
            uVar13 = uVar31 - uVar12;
            if (uVar31 < uVar12) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar13 = uVar31;
            }
            else {
              uVar12 = uVar18 - uVar12;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar23 = uVar23 | 1;
            }
            uVar23 = uVar23 - 6;
            uVar18 = uVar12;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (coder->match_len_decoder).choice = uVar2 - (uVar2 >> 5);
switchD_005bc663_caseD_18:
            uVar23 = uVar18;
            uVar13 = uVar19;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_MATCH_LEN_CHOICE2;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar23 = uVar18 << 8;
              uVar13 = (uint)*pbVar1 | uVar19 << 8;
            }
            uVar2 = (coder->match_len_decoder).choice2;
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar19 = uVar13 - uVar18;
            if (uVar13 < uVar18) {
              (coder->match_len_decoder).choice2 = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_005bc663_caseD_19:
              uVar23 = uVar18;
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_MID0;
                  uVar19 = uVar13;
                  goto LAB_005bf1a3;
                }
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar13 = (uint)*pbVar1 | uVar13 << 8;
                uVar23 = uVar18 << 8;
              }
              ppVar26 = (coder->match_len_decoder).mid[uVar12] + uVar32;
              uVar2 = *ppVar26;
              uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
              uVar31 = (int)uVar32 * 2;
              uVar32 = (ulong)uVar31;
              uVar19 = uVar13 - uVar18;
              if (uVar13 < uVar18) {
                *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar19 = uVar13;
              }
              else {
                uVar18 = uVar23 - uVar18;
                *ppVar26 = uVar2 - (uVar2 >> 5);
                uVar32 = (ulong)(uVar31 | 1);
              }
switchD_005bc663_caseD_1a:
              uVar13 = uVar18;
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_MID1;
                  goto LAB_005bf1a3;
                }
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar13 = uVar18 << 8;
              }
              ppVar26 = (coder->match_len_decoder).mid[uVar12] + uVar32;
              uVar2 = *ppVar26;
              uVar18 = (uVar13 >> 0xb) * (uint)uVar2;
              uVar23 = (int)uVar32 * 2;
              uVar32 = (ulong)uVar23;
              uVar31 = uVar19 - uVar18;
              if (uVar19 < uVar18) {
                *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar31 = uVar19;
              }
              else {
                uVar18 = uVar13 - uVar18;
                *ppVar26 = uVar2 - (uVar2 >> 5);
                uVar32 = (ulong)(uVar23 | 1);
              }
switchD_005bc663_caseD_1b:
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_MID2;
                  uVar19 = uVar31;
                  goto LAB_005bf1a3;
                }
                uVar18 = uVar18 << 8;
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar31 = (uint)*pbVar1 | uVar31 << 8;
              }
              ppVar26 = (coder->match_len_decoder).mid[uVar12] + uVar32;
              uVar2 = *ppVar26;
              uVar12 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar23 = (int)uVar32 * 2;
              uVar13 = uVar31 - uVar12;
              if (uVar31 < uVar12) {
                *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar13 = uVar31;
              }
              else {
                uVar12 = uVar18 - uVar12;
                *ppVar26 = uVar2 - (uVar2 >> 5);
                uVar23 = uVar23 | 1;
              }
              uVar23 = uVar23 + 2;
              uVar18 = uVar12;
            }
            else {
              uVar18 = uVar23 - uVar18;
              (coder->match_len_decoder).choice2 = uVar2 - (uVar2 >> 5);
              uVar34 = uVar32;
switchD_005bc663_caseD_1c:
              uVar23 = uVar18;
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH0;
                  uVar32 = uVar34;
                  goto LAB_005bf1a3;
                }
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar23 = uVar18 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar34];
              uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
              uVar12 = (int)uVar34 * 2;
              uVar32 = (ulong)uVar12;
              uVar13 = uVar19 - uVar18;
              if (uVar19 < uVar18) {
                (coder->match_len_decoder).high[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar13 = uVar19;
              }
              else {
                uVar18 = uVar23 - uVar18;
                (coder->match_len_decoder).high[uVar34] = uVar2 - (uVar2 >> 5);
                uVar32 = (ulong)(uVar12 | 1);
              }
switchD_005bc663_caseD_1d:
              uVar23 = uVar18;
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH1;
                  uVar19 = uVar13;
                  goto LAB_005bf1a3;
                }
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar13 = (uint)*pbVar1 | uVar13 << 8;
                uVar23 = uVar18 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar32];
              uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
              uVar12 = (int)uVar32 * 2;
              uVar34 = (ulong)uVar12;
              uVar19 = uVar13 - uVar18;
              if (uVar13 < uVar18) {
                (coder->match_len_decoder).high[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar19 = uVar13;
              }
              else {
                uVar18 = uVar23 - uVar18;
                (coder->match_len_decoder).high[uVar32] = uVar2 - (uVar2 >> 5);
                uVar34 = (ulong)(uVar12 | 1);
              }
switchD_005bc663_caseD_1e:
              uVar23 = uVar18;
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH2;
                  uVar32 = uVar34;
                  goto LAB_005bf1a3;
                }
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar23 = uVar18 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar34];
              uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
              uVar12 = (int)uVar34 * 2;
              uVar32 = (ulong)uVar12;
              uVar13 = uVar19 - uVar18;
              if (uVar19 < uVar18) {
                (coder->match_len_decoder).high[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar13 = uVar19;
              }
              else {
                uVar18 = uVar23 - uVar18;
                (coder->match_len_decoder).high[uVar34] = uVar2 - (uVar2 >> 5);
                uVar32 = (ulong)(uVar12 | 1);
              }
switchD_005bc663_caseD_1f:
              uVar23 = uVar18;
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH3;
                  uVar19 = uVar13;
                  goto LAB_005bf1a3;
                }
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar13 = (uint)*pbVar1 | uVar13 << 8;
                uVar23 = uVar18 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar32];
              uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
              uVar12 = (int)uVar32 * 2;
              uVar34 = (ulong)uVar12;
              uVar19 = uVar13 - uVar18;
              if (uVar13 < uVar18) {
                (coder->match_len_decoder).high[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar19 = uVar13;
              }
              else {
                uVar18 = uVar23 - uVar18;
                (coder->match_len_decoder).high[uVar32] = uVar2 - (uVar2 >> 5);
                uVar34 = (ulong)(uVar12 | 1);
              }
switchD_005bc663_caseD_20:
              uVar23 = uVar18;
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH4;
                  uVar32 = uVar34;
                  goto LAB_005bf1a3;
                }
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar23 = uVar18 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar34];
              uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
              uVar12 = (int)uVar34 * 2;
              uVar32 = (ulong)uVar12;
              uVar13 = uVar19 - uVar18;
              if (uVar19 < uVar18) {
                (coder->match_len_decoder).high[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar13 = uVar19;
              }
              else {
                uVar18 = uVar23 - uVar18;
                (coder->match_len_decoder).high[uVar34] = uVar2 - (uVar2 >> 5);
                uVar32 = (ulong)(uVar12 | 1);
              }
switchD_005bc663_caseD_21:
              uVar23 = uVar18;
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH5;
                  uVar19 = uVar13;
                  goto LAB_005bf1a3;
                }
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar13 = (uint)*pbVar1 | uVar13 << 8;
                uVar23 = uVar18 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar32];
              uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
              uVar12 = (int)uVar32 * 2;
              uVar34 = (ulong)uVar12;
              uVar19 = uVar13 - uVar18;
              if (uVar13 < uVar18) {
                (coder->match_len_decoder).high[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar19 = uVar13;
              }
              else {
                uVar18 = uVar23 - uVar18;
                (coder->match_len_decoder).high[uVar32] = uVar2 - (uVar2 >> 5);
                uVar34 = (ulong)(uVar12 | 1);
              }
switchD_005bc663_caseD_22:
              uVar13 = uVar18;
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH6;
                  uVar32 = uVar34;
                  goto LAB_005bf1a3;
                }
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar13 = uVar18 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar34];
              uVar18 = (uVar13 >> 0xb) * (uint)uVar2;
              uVar23 = (int)uVar34 * 2;
              uVar32 = (ulong)uVar23;
              uVar31 = uVar19 - uVar18;
              if (uVar19 < uVar18) {
                (coder->match_len_decoder).high[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar31 = uVar19;
              }
              else {
                uVar18 = uVar13 - uVar18;
                (coder->match_len_decoder).high[uVar34] = uVar2 - (uVar2 >> 5);
                uVar32 = (ulong)(uVar23 | 1);
              }
switchD_005bc663_caseD_23:
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH7;
                  uVar19 = uVar31;
                  goto LAB_005bf1a3;
                }
                uVar18 = uVar18 << 8;
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar31 = (uint)*pbVar1 | uVar31 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar32];
              uVar12 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar23 = (int)uVar32 * 2;
              uVar13 = uVar31 - uVar12;
              if (uVar31 < uVar12) {
                (coder->match_len_decoder).high[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar13 = uVar31;
              }
              else {
                uVar12 = uVar18 - uVar12;
                (coder->match_len_decoder).high[uVar32] = uVar2 - (uVar2 >> 5);
                uVar23 = uVar23 | 1;
              }
              uVar23 = uVar23 - 0xee;
              uVar18 = uVar12;
            }
          }
          uVar24 = (ulong)uVar23;
          uVar32 = 3;
          if (uVar23 < 6) {
            uVar32 = (ulong)(uVar23 - 2);
          }
          papVar28 = (probability (*) [768])(coder->pos_slot + uVar32);
          uVar34 = 1;
switchD_005bc663_caseD_24:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_POS_SLOT0;
              uVar32 = uVar34;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = (uint)*pbVar1 | uVar13 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar34];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar34 * 2;
          uVar32 = (ulong)uVar12;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            (*papVar28)[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar13;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar34] = uVar2 - (uVar2 >> 5);
            uVar32 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_25:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_POS_SLOT1;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar32];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar32 * 2;
          uVar34 = (ulong)uVar12;
          uVar13 = uVar19 - uVar18;
          if (uVar19 < uVar18) {
            (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar19;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
            uVar34 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_26:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_POS_SLOT2;
              uVar32 = uVar34;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = (uint)*pbVar1 | uVar13 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar34];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar34 * 2;
          uVar32 = (ulong)uVar12;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            (*papVar28)[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar13;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar34] = uVar2 - (uVar2 >> 5);
            uVar32 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_27:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_POS_SLOT3;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar32];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar32 * 2;
          uVar34 = (ulong)uVar12;
          uVar13 = uVar19 - uVar18;
          if (uVar19 < uVar18) {
            (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar19;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
            uVar34 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_28:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_POS_SLOT4;
              uVar32 = uVar34;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = (uint)*pbVar1 | uVar13 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar34];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar34 * 2;
          uVar32 = (ulong)uVar12;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            (*papVar28)[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar13;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar34] = uVar2 - (uVar2 >> 5);
            uVar32 = (ulong)(uVar12 | 1);
          }
switchD_005bc663_caseD_29:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_POS_SLOT5;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (*papVar28)[uVar32];
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar12 = (int)uVar32 * 2;
          uVar13 = uVar19 - uVar18;
          if (uVar19 < uVar18) {
            (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar19;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
            uVar12 = uVar12 | 1;
          }
          uVar23 = uVar12 - 0x40;
          uVar25 = (ulong)uVar23;
          if (0x3f < uVar23) {
            __assert_fail("symbol <= 63",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x213,
                          "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          uVar32 = uVar25;
          if (uVar23 < 4) {
switchD_005be557_default:
            if (uVar25 < local_d8) goto LAB_005befb7;
          }
          else {
            uVar16 = (uVar23 >> 1) - 1;
            uVar19 = uVar12 & 1 | 2;
            uVar30 = (ulong)uVar19;
            if (uVar23 < 0xe) {
              if (5 < uVar16) {
                __assert_fail("limit <= 5",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x222,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              uVar19 = uVar19 << ((byte)uVar16 & 0x1f);
              uVar30 = (ulong)uVar19;
              iVar20 = (uVar19 - uVar12) + 0x3f;
              if (iVar20 < -1) {
                __assert_fail("(int32_t)(rep0 - symbol - 1) >= -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x22c,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              if (0x52 < iVar20) {
                __assert_fail("(int32_t)(rep0 - symbol - 1) <= 82",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x22e,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              papVar28 = (probability (*) [768])
                         ((long)coder + uVar25 * -2 + (ulong)uVar19 * 2 + 0x655e);
              uVar14 = 0;
              uVar32 = 1;
switchD_005bc663_caseD_2a:
              uVar25 = uVar30;
              uVar34 = uVar32;
              switch(uVar16) {
              case 1:
                goto switchD_005be557_caseD_1;
              case 2:
                goto switchD_005be557_caseD_2;
              case 3:
                goto switchD_005be557_caseD_3;
              case 4:
switchD_005be557_caseD_4:
                if (0xffffff < uVar18) {
LAB_005beda9:
                  uVar2 = (*papVar28)[uVar34];
                  uVar12 = (uVar18 >> 0xb) * (uint)uVar2;
                  uVar16 = (int)uVar34 * 2;
                  uVar23 = uVar13 - uVar12;
                  if (uVar13 < uVar12) {
                    (*papVar28)[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
                    uVar23 = uVar13;
                    uVar18 = uVar12;
                  }
                  else {
                    uVar18 = uVar18 - uVar12;
                    (*papVar28)[uVar34] = uVar2 - (uVar2 >> 5);
                    uVar16 = uVar16 | 1;
                    uVar30 = (ulong)(uint)((1 << ((byte)uVar14 & 0x1f)) + (int)uVar30);
                  }
                  uVar32 = (ulong)uVar16;
                  uVar14 = uVar14 + 1;
                  uVar25 = uVar30;
                  uVar13 = uVar23;
                  goto switchD_005be557_caseD_3;
                }
                if (sVar29 != in_size) {
                  uVar18 = uVar18 << 8;
                  pbVar1 = in + sVar29;
                  sVar29 = sVar29 + 1;
                  uVar13 = (uint)*pbVar1 | uVar13 << 8;
                  goto LAB_005beda9;
                }
                coder->sequence = SEQ_POS_MODEL;
                uVar16 = 4;
                goto LAB_005bf8d7;
              case 5:
                if (uVar14 != 0) {
                  __assert_fail("offset == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x23d,
                                "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                uVar16 = uVar13;
                uVar14 = uVar18;
                if (0xffffff < uVar18) {
LAB_005bed25:
                  uVar2 = (*papVar28)[uVar32];
                  uVar18 = (uVar14 >> 0xb) * (uint)uVar2;
                  uVar23 = (int)uVar32 * 2;
                  uVar34 = (ulong)uVar23;
                  uVar13 = uVar16 - uVar18;
                  if (uVar16 < uVar18) {
                    (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
                    uVar14 = 1;
                    uVar13 = uVar16;
                  }
                  else {
                    uVar18 = uVar14 - uVar18;
                    (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
                    uVar34 = (ulong)(uVar23 | 1);
                    uVar30 = (ulong)((int)uVar30 + 1);
                    uVar14 = 1;
                  }
                  goto switchD_005be557_caseD_4;
                }
                if (sVar29 != in_size) {
                  pbVar1 = in + sVar29;
                  sVar29 = sVar29 + 1;
                  uVar16 = (uint)*pbVar1 | uVar13 << 8;
                  uVar14 = uVar18 << 8;
                  goto LAB_005bed25;
                }
                coder->sequence = SEQ_POS_MODEL;
                uVar14 = 0;
                uVar16 = 5;
                goto LAB_005bf33c;
              default:
                goto switchD_005be557_default;
              }
            }
            if (uVar16 < 6) {
              __assert_fail("limit >= 6",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x266,
                            "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            uVar16 = (uVar23 >> 1) - 5;
switchD_005bc663_caseD_2b:
            do {
              if (uVar18 < 0x1000000) {
                if (sVar29 == in_size) {
                  coder->sequence = SEQ_DIRECT;
                  uVar19 = uVar13;
                  goto LAB_005bf1a3;
                }
                uVar18 = uVar18 << 8;
                pbVar1 = in + sVar29;
                sVar29 = sVar29 + 1;
                uVar13 = uVar13 << 8 | (uint)*pbVar1;
              }
              uVar18 = uVar18 >> 1;
              uVar23 = (int)(uVar13 - uVar18) >> 0x1f;
              uVar12 = uVar23 + (int)uVar30 * 2 + 1;
              uVar30 = (ulong)uVar12;
              uVar13 = (uVar23 & uVar18) + (uVar13 - uVar18);
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
            uVar30 = (ulong)(uVar12 * 0x10);
            uVar16 = 0;
            uVar32 = 1;
switchD_005bc663_caseD_2c:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_ALIGN0;
                uVar19 = uVar13;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar13 = (uint)*pbVar1 | uVar13 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = coder->pos_align[uVar32];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar12 = (int)uVar32 * 2;
            uVar33 = (ulong)uVar12;
            uVar19 = uVar13 - uVar18;
            if (uVar13 < uVar18) {
              coder->pos_align[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar30;
              uVar19 = uVar13;
            }
            else {
              uVar18 = uVar23 - uVar18;
              coder->pos_align[uVar32] = uVar2 - (uVar2 >> 5);
              uVar33 = (ulong)(uVar12 | 1);
              uVar25 = (ulong)((int)uVar30 + 1);
            }
switchD_005bc663_caseD_2d:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_ALIGN1;
                uVar30 = uVar25;
                uVar32 = uVar33;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = coder->pos_align[uVar33];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar12 = (int)uVar33 * 2;
            uVar34 = (ulong)uVar12;
            uVar13 = uVar19 - uVar18;
            if (uVar19 < uVar18) {
              coder->pos_align[uVar33] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar13 = uVar19;
            }
            else {
              uVar18 = uVar23 - uVar18;
              coder->pos_align[uVar33] = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar12 | 1);
              uVar25 = (ulong)((int)uVar25 + 2);
            }
switchD_005bc663_caseD_2e:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_ALIGN2;
                uVar30 = uVar25;
                uVar32 = uVar34;
                uVar19 = uVar13;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar13 = (uint)*pbVar1 | uVar13 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = coder->pos_align[uVar34];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar12 = (int)uVar34 * 2;
            uVar32 = (ulong)uVar12;
            uVar19 = uVar13 - uVar18;
            if (uVar13 < uVar18) {
              coder->pos_align[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar13;
            }
            else {
              uVar18 = uVar23 - uVar18;
              coder->pos_align[uVar34] = uVar2 - (uVar2 >> 5);
              uVar32 = (ulong)(uVar12 | 1);
              uVar25 = (ulong)((int)uVar25 + 4);
            }
switchD_005bc663_caseD_2f:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_ALIGN3;
                uVar30 = uVar25;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = coder->pos_align[uVar32];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar13 = uVar19 - uVar18;
            if (uVar19 < uVar18) {
              coder->pos_align[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar13 = uVar19;
            }
            else {
              uVar18 = uVar23 - uVar18;
              coder->pos_align[uVar32] = uVar2 - (uVar2 >> 5);
              uVar25 = (ulong)((int)uVar25 + 8);
            }
            if ((int)uVar25 != -1) goto switchD_005be557_default;
            uVar30 = 0xffffffff;
            uVar25 = uVar30;
            if (coder->uncompressed_size == 0xffffffffffffffff) goto switchD_005bc663_caseD_30;
          }
          uVar11 = (uint32_t)uVar32;
          uVar17 = (uint)uVar25;
          lVar27 = LZMA_DATA_ERROR;
          goto LAB_005bf18b;
        }
        uVar18 = uVar31 - uVar18;
        coder->is_rep[uVar25] = uVar2 - (uVar2 >> 5);
        local_ec = uVar23;
        if (local_d8 == 0) {
          bVar35 = false;
          lVar27 = LZMA_DATA_ERROR;
          uVar13 = uVar19;
          goto LAB_005bf1a7;
        }
switchD_005bc663_caseD_31:
        uVar13 = uVar19;
        uVar23 = uVar18;
        if (uVar18 < 0x1000000) {
          if (sVar29 == in_size) {
            coder->sequence = SEQ_IS_REP0;
            goto LAB_005bf1a3;
          }
          pbVar1 = in + sVar29;
          sVar29 = sVar29 + 1;
          uVar13 = (uint)*pbVar1 | uVar19 << 8;
          uVar23 = uVar18 << 8;
        }
        uVar25 = (ulong)local_f0;
        uVar2 = coder->is_rep0[uVar25];
        uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
        uVar19 = uVar13 - uVar18;
        if (uVar13 < uVar18) {
          coder->is_rep0[uVar25] = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_005bc663_caseD_33:
          uVar31 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_IS_REP0_LONG;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = (uint)*pbVar1 | uVar13 << 8;
            uVar31 = uVar18 << 8;
          }
          ppVar26 = coder->is_rep0_long[local_f0] + uVar12;
          uVar2 = *ppVar26;
          uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
          if (uVar13 < uVar18) {
            *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            local_f0 = (uint)(STATE_SHORTREP_LIT < local_f0) * 2 + STATE_LIT_SHORTREP;
switchD_005bc663_caseD_32:
            uVar11 = (uint32_t)uVar32;
            uVar17 = (uint)uVar30;
            uVar25 = local_c0;
            if (local_c0 != uVar21) {
              sVar15 = 0;
              if (local_c0 <= uVar30) {
                sVar15 = sVar7;
              }
              uVar25 = local_c0 + 1;
              __src[local_c0] = __src[sVar15 + ~uVar30 + local_c0];
              if (local_d8 < uVar25) {
                local_d8 = uVar25;
              }
            }
            if (local_c0 != uVar21) goto LAB_005bc6c9;
            coder->sequence = SEQ_SHORTREP;
            lVar27 = LZMA_OK;
            bVar35 = true;
            local_c0 = uVar25;
            goto LAB_005bf1a7;
          }
          *ppVar26 = uVar2 - (uVar2 >> 5);
          uVar19 = (uint)uVar30;
          uVar13 = uVar13 - uVar18;
          uVar23 = local_dc;
          uVar18 = uVar31 - uVar18;
        }
        else {
          uVar18 = uVar23 - uVar18;
          coder->is_rep0[uVar25] = uVar2 - (uVar2 >> 5);
switchD_005bc663_caseD_34:
          uVar23 = (uint)uVar30;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_IS_REP1;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
          }
          uVar25 = (ulong)local_f0;
          uVar2 = coder->is_rep1[uVar25];
          uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar13 = uVar19 - uVar31;
          if (uVar19 < uVar31) {
            coder->is_rep1[uVar25] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar19;
            uVar19 = local_dc;
            uVar18 = uVar31;
          }
          else {
            uVar18 = uVar18 - uVar31;
            coder->is_rep1[uVar25] = uVar2 - (uVar2 >> 5);
switchD_005bc663_caseD_35:
            uVar19 = local_ac;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_IS_REP2;
                uVar19 = uVar13;
                goto LAB_005bf1a3;
              }
              uVar18 = uVar18 << 8;
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar13 = (uint)*pbVar1 | uVar13 << 8;
            }
            uVar32 = (ulong)local_f0;
            uVar2 = coder->is_rep2[uVar32];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar23 = (uint)uVar30;
            if (uVar13 < uVar31) {
              coder->is_rep2[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = local_ec;
              local_ec = local_dc;
              uVar18 = uVar31;
            }
            else {
              coder->is_rep2[uVar32] = uVar2 - (uVar2 >> 5);
              local_ac = local_ec;
              uVar13 = uVar13 - uVar31;
              local_ec = local_dc;
              uVar18 = uVar18 - uVar31;
            }
          }
        }
        local_f0 = (uint)(STATE_SHORTREP_LIT < local_f0) * 3 + STATE_LIT_LONGREP;
        uVar32 = 1;
        uVar30 = (ulong)uVar19;
        local_dc = uVar23;
switchD_005bc663_caseD_36:
        uVar23 = uVar18;
        if (uVar18 < 0x1000000) {
          if (sVar29 == in_size) {
            coder->sequence = SEQ_REP_LEN_CHOICE;
            uVar19 = uVar13;
            goto LAB_005bf1a3;
          }
          pbVar1 = in + sVar29;
          sVar29 = sVar29 + 1;
          uVar13 = (uint)*pbVar1 | uVar13 << 8;
          uVar23 = uVar18 << 8;
        }
        uVar2 = (coder->rep_len_decoder).choice;
        uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
        uVar19 = uVar13 - uVar18;
        if (uVar13 < uVar18) {
          (coder->rep_len_decoder).choice = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_005bc663_caseD_37:
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_REP_LEN_LOW0;
              uVar19 = uVar13;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = (uint)*pbVar1 | uVar13 << 8;
            uVar23 = uVar18 << 8;
          }
          ppVar26 = (coder->rep_len_decoder).low[uVar12] + uVar32;
          uVar2 = *ppVar26;
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar32 * 2;
          uVar32 = (ulong)uVar31;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar13;
          }
          else {
            uVar18 = uVar23 - uVar18;
            *ppVar26 = uVar2 - (uVar2 >> 5);
            uVar32 = (ulong)(uVar31 | 1);
          }
switchD_005bc663_caseD_38:
          uVar13 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_REP_LEN_LOW1;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar13 = uVar18 << 8;
          }
          ppVar26 = (coder->rep_len_decoder).low[uVar12] + uVar32;
          uVar2 = *ppVar26;
          uVar18 = (uVar13 >> 0xb) * (uint)uVar2;
          uVar23 = (int)uVar32 * 2;
          uVar32 = (ulong)uVar23;
          uVar31 = uVar19 - uVar18;
          if (uVar19 < uVar18) {
            *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar31 = uVar19;
          }
          else {
            uVar18 = uVar13 - uVar18;
            *ppVar26 = uVar2 - (uVar2 >> 5);
            uVar32 = (ulong)(uVar23 | 1);
          }
switchD_005bc663_caseD_39:
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_REP_LEN_LOW2;
              uVar19 = uVar31;
              goto LAB_005bf1a3;
            }
            uVar18 = uVar18 << 8;
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
          }
          ppVar26 = (coder->rep_len_decoder).low[uVar12] + uVar32;
          uVar2 = *ppVar26;
          uVar12 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar23 = (int)uVar32 * 2;
          uVar13 = uVar31 - uVar12;
          if (uVar31 < uVar12) {
            *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar31;
            uVar18 = uVar12;
          }
          else {
            uVar18 = uVar18 - uVar12;
            *ppVar26 = uVar2 - (uVar2 >> 5);
            uVar23 = uVar23 | 1;
          }
          uVar12 = uVar23 - 6;
          uVar25 = uVar30;
        }
        else {
          uVar18 = uVar23 - uVar18;
          (coder->rep_len_decoder).choice = uVar2 - (uVar2 >> 5);
switchD_005bc663_caseD_3a:
          uVar13 = uVar19;
          uVar23 = uVar18;
          if (uVar18 < 0x1000000) {
            if (sVar29 == in_size) {
              coder->sequence = SEQ_REP_LEN_CHOICE2;
              goto LAB_005bf1a3;
            }
            pbVar1 = in + sVar29;
            sVar29 = sVar29 + 1;
            uVar13 = (uint)*pbVar1 | uVar19 << 8;
            uVar23 = uVar18 << 8;
          }
          uVar2 = (coder->rep_len_decoder).choice2;
          uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
          uVar19 = uVar13 - uVar18;
          if (uVar13 < uVar18) {
            (coder->rep_len_decoder).choice2 = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_005bc663_caseD_3b:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_MID0;
                uVar19 = uVar13;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar13 = (uint)*pbVar1 | uVar13 << 8;
              uVar23 = uVar18 << 8;
            }
            ppVar26 = (coder->rep_len_decoder).mid[uVar12] + uVar32;
            uVar2 = *ppVar26;
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar31 = (int)uVar32 * 2;
            uVar32 = (ulong)uVar31;
            uVar19 = uVar13 - uVar18;
            if (uVar13 < uVar18) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar13;
            }
            else {
              uVar18 = uVar23 - uVar18;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar32 = (ulong)(uVar31 | 1);
            }
switchD_005bc663_caseD_3c:
            uVar13 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_MID1;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar13 = uVar18 << 8;
            }
            ppVar26 = (coder->rep_len_decoder).mid[uVar12] + uVar32;
            uVar2 = *ppVar26;
            uVar18 = (uVar13 >> 0xb) * (uint)uVar2;
            uVar23 = (int)uVar32 * 2;
            uVar32 = (ulong)uVar23;
            uVar31 = uVar19 - uVar18;
            if (uVar19 < uVar18) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar31 = uVar19;
            }
            else {
              uVar18 = uVar13 - uVar18;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar32 = (ulong)(uVar23 | 1);
            }
switchD_005bc663_caseD_3d:
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_MID2;
                uVar19 = uVar31;
                goto LAB_005bf1a3;
              }
              uVar18 = uVar18 << 8;
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar31 = (uint)*pbVar1 | uVar31 << 8;
            }
            ppVar26 = (coder->rep_len_decoder).mid[uVar12] + uVar32;
            uVar2 = *ppVar26;
            uVar12 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar23 = (int)uVar32 * 2;
            uVar13 = uVar31 - uVar12;
            if (uVar31 < uVar12) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar13 = uVar31;
              uVar18 = uVar12;
            }
            else {
              uVar18 = uVar18 - uVar12;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar23 = uVar23 | 1;
            }
            uVar12 = uVar23 + 2;
            uVar25 = uVar30;
          }
          else {
            uVar18 = uVar23 - uVar18;
            (coder->rep_len_decoder).choice2 = uVar2 - (uVar2 >> 5);
            uVar34 = uVar32;
switchD_005bc663_caseD_3e:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_HIGH0;
                uVar32 = uVar34;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = (coder->rep_len_decoder).high[uVar34];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar12 = (int)uVar34 * 2;
            uVar32 = (ulong)uVar12;
            uVar13 = uVar19 - uVar18;
            if (uVar19 < uVar18) {
              (coder->rep_len_decoder).high[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar13 = uVar19;
            }
            else {
              uVar18 = uVar23 - uVar18;
              (coder->rep_len_decoder).high[uVar34] = uVar2 - (uVar2 >> 5);
              uVar32 = (ulong)(uVar12 | 1);
            }
switchD_005bc663_caseD_3f:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_HIGH1;
                uVar19 = uVar13;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar13 = (uint)*pbVar1 | uVar13 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = (coder->rep_len_decoder).high[uVar32];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar12 = (int)uVar32 * 2;
            uVar34 = (ulong)uVar12;
            uVar19 = uVar13 - uVar18;
            if (uVar13 < uVar18) {
              (coder->rep_len_decoder).high[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar13;
            }
            else {
              uVar18 = uVar23 - uVar18;
              (coder->rep_len_decoder).high[uVar32] = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar12 | 1);
            }
switchD_005bc663_caseD_40:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_HIGH2;
                uVar32 = uVar34;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = (coder->rep_len_decoder).high[uVar34];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar12 = (int)uVar34 * 2;
            uVar32 = (ulong)uVar12;
            uVar13 = uVar19 - uVar18;
            if (uVar19 < uVar18) {
              (coder->rep_len_decoder).high[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar13 = uVar19;
            }
            else {
              uVar18 = uVar23 - uVar18;
              (coder->rep_len_decoder).high[uVar34] = uVar2 - (uVar2 >> 5);
              uVar32 = (ulong)(uVar12 | 1);
            }
switchD_005bc663_caseD_41:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_HIGH3;
                uVar19 = uVar13;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar13 = (uint)*pbVar1 | uVar13 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = (coder->rep_len_decoder).high[uVar32];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar12 = (int)uVar32 * 2;
            uVar34 = (ulong)uVar12;
            uVar19 = uVar13 - uVar18;
            if (uVar13 < uVar18) {
              (coder->rep_len_decoder).high[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar13;
            }
            else {
              uVar18 = uVar23 - uVar18;
              (coder->rep_len_decoder).high[uVar32] = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar12 | 1);
            }
switchD_005bc663_caseD_42:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_HIGH4;
                uVar32 = uVar34;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = (coder->rep_len_decoder).high[uVar34];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar12 = (int)uVar34 * 2;
            uVar32 = (ulong)uVar12;
            uVar13 = uVar19 - uVar18;
            if (uVar19 < uVar18) {
              (coder->rep_len_decoder).high[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar13 = uVar19;
            }
            else {
              uVar18 = uVar23 - uVar18;
              (coder->rep_len_decoder).high[uVar34] = uVar2 - (uVar2 >> 5);
              uVar32 = (ulong)(uVar12 | 1);
            }
switchD_005bc663_caseD_43:
            uVar23 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_HIGH5;
                uVar19 = uVar13;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar13 = (uint)*pbVar1 | uVar13 << 8;
              uVar23 = uVar18 << 8;
            }
            uVar2 = (coder->rep_len_decoder).high[uVar32];
            uVar18 = (uVar23 >> 0xb) * (uint)uVar2;
            uVar12 = (int)uVar32 * 2;
            uVar34 = (ulong)uVar12;
            uVar19 = uVar13 - uVar18;
            if (uVar13 < uVar18) {
              (coder->rep_len_decoder).high[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar13;
            }
            else {
              uVar18 = uVar23 - uVar18;
              (coder->rep_len_decoder).high[uVar32] = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar12 | 1);
            }
switchD_005bc663_caseD_44:
            uVar13 = uVar18;
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_HIGH6;
                uVar32 = uVar34;
                goto LAB_005bf1a3;
              }
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar13 = uVar18 << 8;
            }
            uVar2 = (coder->rep_len_decoder).high[uVar34];
            uVar18 = (uVar13 >> 0xb) * (uint)uVar2;
            uVar23 = (int)uVar34 * 2;
            uVar32 = (ulong)uVar23;
            uVar31 = uVar19 - uVar18;
            if (uVar19 < uVar18) {
              (coder->rep_len_decoder).high[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar31 = uVar19;
            }
            else {
              uVar18 = uVar13 - uVar18;
              (coder->rep_len_decoder).high[uVar34] = uVar2 - (uVar2 >> 5);
              uVar32 = (ulong)(uVar23 | 1);
            }
switchD_005bc663_caseD_45:
            if (uVar18 < 0x1000000) {
              if (sVar29 == in_size) {
                coder->sequence = SEQ_REP_LEN_HIGH7;
                uVar19 = uVar31;
                goto LAB_005bf1a3;
              }
              uVar18 = uVar18 << 8;
              pbVar1 = in + sVar29;
              sVar29 = sVar29 + 1;
              uVar31 = (uint)*pbVar1 | uVar31 << 8;
            }
            uVar2 = (coder->rep_len_decoder).high[uVar32];
            uVar12 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar23 = (int)uVar32 * 2;
            uVar13 = uVar31 - uVar12;
            if (uVar31 < uVar12) {
              (coder->rep_len_decoder).high[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar13 = uVar31;
              uVar18 = uVar12;
            }
            else {
              uVar18 = uVar18 - uVar12;
              (coder->rep_len_decoder).high[uVar32] = uVar2 - (uVar2 >> 5);
              uVar23 = uVar23 | 1;
            }
            uVar12 = uVar23 - 0xee;
            uVar25 = uVar30;
          }
        }
        uVar32 = (ulong)uVar23;
        uVar24 = (ulong)uVar12;
LAB_005befb7:
        if ((uint)uVar24 < 2) {
          __assert_fail("len >= MATCH_LEN_MIN",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x312,
                        "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        uVar30 = uVar25;
        if (0x111 < (uint)uVar24) {
          __assert_fail("len <= MATCH_LEN_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x313,
                        "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
switchD_005bc663_caseD_46:
        uVar34 = uVar21 - local_c0 & 0xffffffff;
        if (uVar24 <= uVar21 - local_c0) {
          uVar34 = uVar24;
        }
        uVar12 = (uint)uVar34;
        uVar23 = (int)uVar24 - uVar12;
        uVar24 = (ulong)uVar23;
        if ((uint)uVar30 < uVar12) {
          uVar25 = local_c0;
          do {
            sVar15 = sVar7;
            if (uVar30 < uVar25) {
              sVar15 = 0;
            }
            __src[uVar25] = __src[uVar25 + sVar15 + ~uVar30];
            uVar25 = uVar25 + 1;
            uVar12 = (int)uVar34 - 1;
            uVar34 = (ulong)uVar12;
          } while (uVar12 != 0);
        }
        else if (uVar30 < local_c0) {
          memcpy(__src + local_c0,__src + local_c0 + ~uVar30,uVar34);
          uVar25 = local_c0 + uVar34;
        }
        else {
          if (local_d8 != sVar7) {
            __assert_fail("dict->full == dict->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_decoder.h"
                          ,0xa0,"_Bool dict_repeat(lzma_dict *, uint32_t, uint32_t *)");
          }
          iVar20 = ~(uint)uVar30 + (int)local_c0;
          uVar19 = -iVar20;
          if (uVar19 < uVar12) {
            memmove(__src + local_c0,__src + (uint)((int)sVar7 + iVar20),(ulong)uVar19);
            local_c0 = local_c0 + uVar19;
            uVar34 = (ulong)(uVar12 + iVar20);
            memcpy(__src + local_c0,__src,uVar34);
          }
          else {
            memmove(__src + local_c0,__src + (uint)((int)sVar7 + iVar20),uVar34);
          }
          uVar25 = local_c0 + uVar34;
        }
        if (local_d8 <= uVar25) {
          local_d8 = uVar25;
        }
        if (uVar23 != 0) {
          coder->sequence = SEQ_COPY;
          local_c0 = uVar25;
LAB_005bf33c:
          bVar35 = true;
          uVar11 = (uint32_t)uVar32;
          uVar17 = (uint)uVar30;
          lVar27 = LZMA_OK;
          goto LAB_005bf1a7;
        }
      }
LAB_005bc6c9:
      uVar12 = uVar3 & (uint)uVar25;
      local_c0 = uVar25;
      goto switchD_005bc663_caseD_0;
    case SEQ_BLOCK:
      goto switchD_005bc663_caseD_2;
    case SEQ_CODER_INIT:
      goto switchD_005bc663_caseD_3;
    case SEQ_CODE:
      goto switchD_005bc663_caseD_4;
    case SEQ_LITERAL3:
      goto switchD_005bc663_caseD_5;
    case SEQ_CRC32:
      goto switchD_005bc663_caseD_6;
    case SEQ_LITERAL5:
      goto switchD_005bc663_caseD_7;
    case SEQ_LITERAL6:
      goto switchD_005bc663_caseD_8;
    case SEQ_LITERAL7:
      goto switchD_005bc663_caseD_9;
    case SEQ_LITERAL_MATCHED0:
      goto switchD_005bc663_caseD_a;
    case SEQ_LITERAL_MATCHED1:
      goto switchD_005bc663_caseD_b;
    case SEQ_LITERAL_MATCHED2:
      goto switchD_005bc663_caseD_c;
    case SEQ_LITERAL_MATCHED3:
      goto switchD_005bc663_caseD_d;
    case SEQ_LITERAL_MATCHED4:
      goto switchD_005bc663_caseD_e;
    case SEQ_LITERAL_MATCHED5:
      goto switchD_005bc663_caseD_f;
    case SEQ_LITERAL_MATCHED6:
      goto switchD_005bc663_caseD_10;
    case SEQ_LITERAL_MATCHED7:
      goto switchD_005bc663_caseD_11;
    case SEQ_LITERAL_WRITE:
      goto switchD_005bc663_caseD_12;
    case SEQ_IS_REP:
      goto switchD_005bc663_caseD_13;
    case SEQ_MATCH_LEN_CHOICE:
      goto switchD_005bc663_caseD_14;
    case SEQ_MATCH_LEN_LOW0:
      goto switchD_005bc663_caseD_15;
    case SEQ_MATCH_LEN_LOW1:
      goto switchD_005bc663_caseD_16;
    case SEQ_MATCH_LEN_LOW2:
      goto switchD_005bc663_caseD_17;
    case SEQ_MATCH_LEN_CHOICE2:
      goto switchD_005bc663_caseD_18;
    case SEQ_MATCH_LEN_MID0:
      goto switchD_005bc663_caseD_19;
    case SEQ_MATCH_LEN_MID1:
      goto switchD_005bc663_caseD_1a;
    case SEQ_MATCH_LEN_MID2:
      goto switchD_005bc663_caseD_1b;
    case SEQ_MATCH_LEN_HIGH0:
      goto switchD_005bc663_caseD_1c;
    case SEQ_MATCH_LEN_HIGH1:
      goto switchD_005bc663_caseD_1d;
    case SEQ_MATCH_LEN_HIGH2:
      goto switchD_005bc663_caseD_1e;
    case SEQ_MATCH_LEN_HIGH3:
      goto switchD_005bc663_caseD_1f;
    case SEQ_MATCH_LEN_HIGH4:
      goto switchD_005bc663_caseD_20;
    case SEQ_MATCH_LEN_HIGH5:
      goto switchD_005bc663_caseD_21;
    case SEQ_MATCH_LEN_HIGH6:
      goto switchD_005bc663_caseD_22;
    case SEQ_MATCH_LEN_HIGH7:
      goto switchD_005bc663_caseD_23;
    case SEQ_POS_SLOT0:
      goto switchD_005bc663_caseD_24;
    case SEQ_POS_SLOT1:
      goto switchD_005bc663_caseD_25;
    case SEQ_POS_SLOT2:
      goto switchD_005bc663_caseD_26;
    case SEQ_POS_SLOT3:
      goto switchD_005bc663_caseD_27;
    case SEQ_POS_SLOT4:
      goto switchD_005bc663_caseD_28;
    case SEQ_POS_SLOT5:
      goto switchD_005bc663_caseD_29;
    case SEQ_POS_MODEL:
      goto switchD_005bc663_caseD_2a;
    case SEQ_DIRECT:
      goto switchD_005bc663_caseD_2b;
    case SEQ_ALIGN0:
      goto switchD_005bc663_caseD_2c;
    case SEQ_ALIGN1:
      goto switchD_005bc663_caseD_2d;
    case SEQ_ALIGN2:
      goto switchD_005bc663_caseD_2e;
    case SEQ_ALIGN3:
      goto switchD_005bc663_caseD_2f;
    case SEQ_EOPM:
      goto switchD_005bc663_caseD_30;
    case SEQ_IS_REP0:
      goto switchD_005bc663_caseD_31;
    case SEQ_SHORTREP:
      goto switchD_005bc663_caseD_32;
    case SEQ_IS_REP0_LONG:
      goto switchD_005bc663_caseD_33;
    case SEQ_IS_REP1:
      goto switchD_005bc663_caseD_34;
    case SEQ_IS_REP2:
      goto switchD_005bc663_caseD_35;
    case SEQ_REP_LEN_CHOICE:
      goto switchD_005bc663_caseD_36;
    case SEQ_REP_LEN_LOW0:
      goto switchD_005bc663_caseD_37;
    case SEQ_REP_LEN_LOW1:
      goto switchD_005bc663_caseD_38;
    case SEQ_REP_LEN_LOW2:
      goto switchD_005bc663_caseD_39;
    case SEQ_REP_LEN_CHOICE2:
      goto switchD_005bc663_caseD_3a;
    case SEQ_REP_LEN_MID0:
      goto switchD_005bc663_caseD_3b;
    case SEQ_REP_LEN_MID1:
      goto switchD_005bc663_caseD_3c;
    case SEQ_REP_LEN_MID2:
      goto switchD_005bc663_caseD_3d;
    case SEQ_REP_LEN_HIGH0:
      goto switchD_005bc663_caseD_3e;
    case SEQ_REP_LEN_HIGH1:
      goto switchD_005bc663_caseD_3f;
    case SEQ_REP_LEN_HIGH2:
      goto switchD_005bc663_caseD_40;
    case SEQ_REP_LEN_HIGH3:
      goto switchD_005bc663_caseD_41;
    case SEQ_REP_LEN_HIGH4:
      goto switchD_005bc663_caseD_42;
    case SEQ_REP_LEN_HIGH5:
      goto switchD_005bc663_caseD_43;
    case SEQ_REP_LEN_HIGH6:
      goto switchD_005bc663_caseD_44;
    case SEQ_REP_LEN_HIGH7:
      goto switchD_005bc663_caseD_45;
    case SEQ_COPY:
      goto switchD_005bc663_caseD_46;
    }
  }
  if (uVar18 < 0x1000000) {
    if (sVar29 == in_size) {
      coder->sequence = SEQ_INDICATOR;
      uVar19 = uVar13;
      goto LAB_005bf1a3;
    }
    uVar18 = uVar18 << 8;
    pbVar1 = in + sVar29;
    sVar29 = sVar29 + 1;
    uVar13 = (uint)*pbVar1 | uVar13 << 8;
  }
LAB_005bc6b5:
  coder->sequence = SEQ_BLOCK_HEADER;
  uVar19 = uVar13;
LAB_005bf1a3:
  uVar11 = (uint32_t)uVar32;
  uVar17 = (uint)uVar30;
  lVar27 = LZMA_OK;
  bVar35 = true;
  uVar13 = uVar19;
LAB_005bf1a7:
  dictptr->pos = local_c0;
  dictptr->full = local_d8;
  *in_pos = sVar29;
  (coder->rc).range = uVar18;
  (coder->rc).code = uVar13;
  (coder->rc).init_bytes_left = uVar10;
  coder->state = local_f0;
  coder->rep0 = uVar17;
  coder->rep1 = local_dc;
  coder->rep2 = local_ec;
  coder->rep3 = local_ac;
  coder->probs = *papVar28;
  coder->symbol = uVar11;
  coder->limit = uVar16;
  coder->offset = uVar14;
  coder->len = (uint32_t)uVar24;
  if ((coder->uncompressed_size != 0xffffffffffffffff) &&
     (lVar22 = coder->uncompressed_size + (uVar6 - local_c0), coder->uncompressed_size = lVar22,
     bVar35 && lVar22 == 0)) {
    if (coder->sequence == SEQ_INDICATOR) {
      lVar27 = LZMA_OK;
    }
    else {
      lVar27 = (uint)(coder->sequence != SEQ_BLOCK_HEADER) * 8 + LZMA_STREAM_END;
    }
  }
  if (lVar27 == LZMA_STREAM_END) {
    (coder->rc).range = 0xffffffff;
    (coder->rc).code = 0;
    (coder->rc).init_bytes_left = 5;
    return (uint)(uVar13 != 0) * 8 + LZMA_STREAM_END;
  }
  return lVar27;
switchD_005be557_caseD_3:
  if (uVar18 < 0x1000000) {
    if (sVar29 == in_size) {
      coder->sequence = SEQ_POS_MODEL;
      uVar16 = 3;
      uVar30 = uVar25;
      uVar34 = uVar32;
      goto LAB_005bf8d7;
    }
    uVar18 = uVar18 << 8;
    pbVar1 = in + sVar29;
    sVar29 = sVar29 + 1;
    uVar13 = (uint)*pbVar1 | uVar13 << 8;
  }
  uVar2 = (*papVar28)[uVar32];
  uVar12 = (uVar18 >> 0xb) * (uint)uVar2;
  uVar16 = (int)uVar32 * 2;
  uVar23 = uVar13 - uVar12;
  if (uVar13 < uVar12) {
    (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
    uVar23 = uVar13;
    uVar18 = uVar12;
  }
  else {
    uVar18 = uVar18 - uVar12;
    (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
    uVar16 = uVar16 | 1;
    uVar25 = (ulong)(uint)((1 << ((byte)uVar14 & 0x1f)) + (int)uVar25);
  }
  uVar32 = (ulong)uVar16;
  uVar14 = uVar14 + 1;
  uVar13 = uVar23;
switchD_005be557_caseD_2:
  if (0xffffff < uVar18) {
LAB_005beebf:
    uVar2 = (*papVar28)[uVar32];
    uVar12 = (uVar18 >> 0xb) * (uint)uVar2;
    uVar16 = (int)uVar32 * 2;
    uVar23 = uVar13 - uVar12;
    if (uVar13 < uVar12) {
      (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
      uVar23 = uVar13;
      uVar18 = uVar12;
    }
    else {
      uVar18 = uVar18 - uVar12;
      (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
      uVar16 = uVar16 | 1;
      uVar25 = (ulong)(uint)((1 << ((byte)uVar14 & 0x1f)) + (int)uVar25);
    }
    uVar32 = (ulong)uVar16;
    uVar14 = uVar14 + 1;
    uVar13 = uVar23;
switchD_005be557_caseD_1:
    uVar16 = uVar18;
    if (uVar18 < 0x1000000) {
      if (sVar29 == in_size) {
        coder->sequence = SEQ_POS_MODEL;
        uVar16 = 1;
        uVar30 = uVar25;
        uVar34 = uVar32;
        goto LAB_005bf8d7;
      }
      pbVar1 = in + sVar29;
      sVar29 = sVar29 + 1;
      uVar13 = (uint)*pbVar1 | uVar13 << 8;
      uVar16 = uVar18 << 8;
    }
    uVar2 = (*papVar28)[uVar32];
    uVar18 = (uVar16 >> 0xb) * (uint)uVar2;
    uVar23 = uVar13 - uVar18;
    if (uVar13 < uVar18) {
      (*papVar28)[uVar32] = (short)(0x800 - uVar2 >> 5) + uVar2;
      uVar23 = uVar13;
    }
    else {
      uVar18 = uVar16 - uVar18;
      (*papVar28)[uVar32] = uVar2 - (uVar2 >> 5);
      uVar25 = (ulong)(uint)((1 << ((byte)uVar14 & 0x1f)) + (int)uVar25);
    }
    uVar16 = 1;
    uVar13 = uVar23;
    goto switchD_005be557_default;
  }
  if (sVar29 != in_size) {
    uVar18 = uVar18 << 8;
    pbVar1 = in + sVar29;
    sVar29 = sVar29 + 1;
    uVar13 = (uint)*pbVar1 | uVar13 << 8;
    goto LAB_005beebf;
  }
  coder->sequence = SEQ_POS_MODEL;
  uVar16 = 2;
  uVar30 = uVar25;
  uVar34 = uVar32;
LAB_005bf8d7:
  bVar35 = true;
  lVar27 = LZMA_OK;
  uVar11 = (uint32_t)uVar34;
  uVar17 = (uint)uVar30;
  goto LAB_005bf1a7;
switchD_005bc663_caseD_30:
  uVar11 = (uint32_t)uVar32;
  uVar17 = (uint)uVar30;
  lVar27 = LZMA_STREAM_END;
  if (0xffffff < uVar18) {
LAB_005bf18b:
    bVar35 = false;
    goto LAB_005bf1a7;
  }
  if (sVar29 != in_size) {
    uVar18 = uVar18 << 8;
    pbVar1 = in + sVar29;
    sVar29 = sVar29 + 1;
    bVar35 = false;
    uVar13 = (uint)*pbVar1 | uVar13 << 8;
    goto LAB_005bf1a7;
  }
  coder->sequence = SEQ_EOPM;
  uVar19 = uVar13;
  goto LAB_005bf1a3;
}

Assistant:

static lzma_ret
lzma_decode(lzma_coder *LZMA_RESTRICT coder, lzma_dict *LZMA_RESTRICT dictptr,
		const uint8_t *LZMA_RESTRICT in,
		size_t *LZMA_RESTRICT in_pos, size_t in_size)
{
	///////////////
	// Variables //
	///////////////

	// Making local copies of often-used variables improves both
	// speed and readability.

	lzma_dict dict = *dictptr;

	const size_t dict_start = dict.pos;

	// Range decoder
	rc_to_local(coder->rc, *in_pos);

	// State
	uint32_t state = coder->state;
	uint32_t rep0 = coder->rep0;
	uint32_t rep1 = coder->rep1;
	uint32_t rep2 = coder->rep2;
	uint32_t rep3 = coder->rep3;

	const uint32_t pos_mask = coder->pos_mask;

	// These variables are actually needed only if we last time ran
	// out of input in the middle of the decoder loop.
	probability *probs = coder->probs;
	uint32_t symbol = coder->symbol;
	uint32_t limit = coder->limit;
	uint32_t offset = coder->offset;
	uint32_t len = coder->len;

	const uint32_t literal_pos_mask = coder->literal_pos_mask;
	const uint32_t literal_context_bits = coder->literal_context_bits;

	// Temporary variables
	uint32_t pos_state = dict.pos & pos_mask;

	lzma_ret ret = LZMA_OK;

	// If uncompressed size is known, there must be no end of payload
	// marker.
	const bool no_eopm = coder->uncompressed_size
			!= LZMA_VLI_UNKNOWN;
	if (no_eopm && coder->uncompressed_size < dict.limit - dict.pos)
		dict.limit = dict.pos + (size_t)(coder->uncompressed_size);

	////////////////////
	// Initialization //
	////////////////////

	if (!rc_read_init(&coder->rc, in, in_pos, in_size))
		return LZMA_OK;

	rc = coder->rc;
	rc_in_pos = *in_pos;

	// The main decoder loop. The "switch" is used to restart the decoder at
	// correct location. Once restarted, the "switch" is no longer used.
	switch (coder->sequence)
	while (true) {
		// Calculate new pos_state. This is skipped on the first loop
		// since we already calculated it when setting up the local
		// variables.
		pos_state = dict.pos & pos_mask;

	case SEQ_NORMALIZE:
	case SEQ_IS_MATCH:
		if (unlikely(no_eopm && dict.pos == dict.limit))
			break;

		rc_if_0(coder->is_match[state][pos_state], SEQ_IS_MATCH) {
			static const lzma_lzma_state next_state[] = {
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_MATCH_LIT_LIT,
				STATE_REP_LIT_LIT,
				STATE_SHORTREP_LIT_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT,
				STATE_SHORTREP_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT
			};

			rc_update_0(coder->is_match[state][pos_state]);

			// It's a literal i.e. a single 8-bit byte.

			probs = literal_subcoder(coder->literal,
					literal_context_bits, literal_pos_mask,
					dict.pos, dict_get(&dict, 0));
			symbol = 1;

			if (is_literal_state(state)) {
				// Decode literal without match byte.
#ifdef HAVE_SMALL
	case SEQ_LITERAL:
				do {
					rc_bit(probs[symbol], , , SEQ_LITERAL);
				} while (symbol < (1 << 8));
#else
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL0);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL1);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL2);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL3);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL4);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL5);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL6);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL7);
#endif
			} else {
#ifndef HAVE_SMALL
				uint32_t match_bit;
				uint32_t subcoder_index;
#endif

				// Decode literal with match byte.
				//
				// We store the byte we compare against
				// ("match byte") to "len" to minimize the
				// number of variables we need to store
				// between decoder calls.
				len = dict_get(&dict, rep0) << 1;

				// The usage of "offset" allows omitting some
				// branches, which should give tiny speed
				// improvement on some CPUs. "offset" gets
				// set to zero if match_bit didn't match.
				offset = 0x100;

#ifdef HAVE_SMALL
	case SEQ_LITERAL_MATCHED:
				do {
					const uint32_t match_bit
							= len & offset;
					const uint32_t subcoder_index
							= offset + match_bit
							+ symbol;

					rc_bit(probs[subcoder_index],
							offset &= ~match_bit,
							offset &= match_bit,
							SEQ_LITERAL_MATCHED);

					// It seems to be faster to do this
					// here instead of putting it to the
					// beginning of the loop and then
					// putting the "case" in the middle
					// of the loop.
					len <<= 1;

				} while (symbol < (1 << 8));
#else
				// Unroll the loop.

#	define d(seq) \
		case seq: \
			match_bit = len & offset; \
			subcoder_index = offset + match_bit + symbol; \
			rc_bit(probs[subcoder_index], \
					offset &= ~match_bit, \
					offset &= match_bit, \
					seq)

				d(SEQ_LITERAL_MATCHED0);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED1);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED2);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED3);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED4);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED5);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED6);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED7);
#	undef d
#endif
			}

			//update_literal(state);
			// Use a lookup table to update to literal state,
			// since compared to other state updates, this would
			// need two branches.
			state = next_state[state];

	case SEQ_LITERAL_WRITE:
			if (unlikely(dict_put(&dict, symbol))) {
				coder->sequence = SEQ_LITERAL_WRITE;
				goto out;
			}

			continue;
		}

		// Instead of a new byte we are going to get a byte range
		// (distance and length) which will be repeated from our
		// output history.

		rc_update_1(coder->is_match[state][pos_state]);

	case SEQ_IS_REP:
		rc_if_0(coder->is_rep[state], SEQ_IS_REP) {
			// Not a repeated match
			rc_update_0(coder->is_rep[state]);
			update_match(state);

			// The latest three match distances are kept in
			// memory in case there are repeated matches.
			rep3 = rep2;
			rep2 = rep1;
			rep1 = rep0;

			// Decode the length of the match.
			len_decode(len, coder->match_len_decoder,
					pos_state, SEQ_MATCH_LEN);

			// Prepare to decode the highest two bits of the
			// match distance.
			probs = coder->pos_slot[get_len_to_pos_state(len)];
			symbol = 1;

#ifdef HAVE_SMALL
	case SEQ_POS_SLOT:
			do {
				rc_bit(probs[symbol], , , SEQ_POS_SLOT);
			} while (symbol < POS_SLOTS);
#else
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT0);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT1);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT2);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT3);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT4);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT5);
#endif
			// Get rid of the highest bit that was needed for
			// indexing of the probability array.
			symbol -= POS_SLOTS;
			assert(symbol <= 63);

			if (symbol < START_POS_MODEL_INDEX) {
				// Match distances [0, 3] have only two bits.
				rep0 = symbol;
			} else {
				// Decode the lowest [1, 29] bits of
				// the match distance.
				limit = (symbol >> 1) - 1;
				assert(limit >= 1 && limit <= 30);
				rep0 = 2 + (symbol & 1);

				if (symbol < END_POS_MODEL_INDEX) {
					// Prepare to decode the low bits for
					// a distance of [4, 127].
					assert(limit <= 5);
					rep0 <<= limit;
					assert(rep0 <= 96);
					// -1 is fine, because we start
					// decoding at probs[1], not probs[0].
					// NOTE: This violates the C standard,
					// since we are doing pointer
					// arithmetic past the beginning of
					// the array.
					assert((int32_t)(rep0 - symbol - 1)
							>= -1);
					assert((int32_t)(rep0 - symbol - 1)
							<= 82);
					probs = coder->pos_special + rep0
							- symbol - 1;
					symbol = 1;
					offset = 0;
	case SEQ_POS_MODEL:
#ifdef HAVE_SMALL
					do {
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
					} while (++offset < limit);
#else
					switch (limit) {
					case 5:
						assert(offset == 0);
						rc_bit(probs[symbol], 0,
							rep0 += 1,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 4:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 3:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 2:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 1:
						// We need "symbol" only for
						// indexing the probability
						// array, thus we can use
						// rc_bit_last() here to omit
						// the unneeded updating of
						// "symbol".
						rc_bit_last(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
					}
#endif
				} else {
					// The distance is >= 128. Decode the
					// lower bits without probabilities
					// except the lowest four bits.
					assert(symbol >= 14);
					assert(limit >= 6);
					limit -= ALIGN_BITS;
					assert(limit >= 2);
	case SEQ_DIRECT:
					// Not worth manual unrolling
					do {
						rc_direct(rep0, SEQ_DIRECT);
					} while (--limit > 0);

					// Decode the lowest four bits using
					// probabilities.
					rep0 <<= ALIGN_BITS;
					symbol = 1;
#ifdef HAVE_SMALL
					offset = 0;
	case SEQ_ALIGN:
					do {
						rc_bit(coder->pos_align[
								symbol], ,
							rep0 += 1 << offset,
							SEQ_ALIGN);
					} while (++offset < ALIGN_BITS);
#else
	case SEQ_ALIGN0:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 1, SEQ_ALIGN0);
	case SEQ_ALIGN1:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 2, SEQ_ALIGN1);
	case SEQ_ALIGN2:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 4, SEQ_ALIGN2);
	case SEQ_ALIGN3:
					// Like in SEQ_POS_MODEL, we don't
					// need "symbol" for anything else
					// than indexing the probability array.
					rc_bit_last(coder->pos_align[symbol], 0,
							rep0 += 8, SEQ_ALIGN3);
#endif

					if (rep0 == UINT32_MAX) {
						// End of payload marker was
						// found. It must not be
						// present if uncompressed
						// size is known.
						if (coder->uncompressed_size
						!= LZMA_VLI_UNKNOWN) {
							ret = LZMA_DATA_ERROR;
							goto out;
						}

	case SEQ_EOPM:
						// LZMA1 stream with
						// end-of-payload marker.
						rc_normalize(SEQ_EOPM);
						ret = LZMA_STREAM_END;
						goto out;
					}
				}
			}

			// Validate the distance we just decoded.
			if (unlikely(!dict_is_distance_valid(&dict, rep0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

		} else {
			rc_update_1(coder->is_rep[state]);

			// Repeated match
			//
			// The match distance is a value that we have had
			// earlier. The latest four match distances are
			// available as rep0, rep1, rep2 and rep3. We will
			// now decode which of them is the new distance.
			//
			// There cannot be a match if we haven't produced
			// any output, so check that first.
			if (unlikely(!dict_is_distance_valid(&dict, 0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

	case SEQ_IS_REP0:
			rc_if_0(coder->is_rep0[state], SEQ_IS_REP0) {
				rc_update_0(coder->is_rep0[state]);
				// The distance is rep0.

	case SEQ_IS_REP0_LONG:
				rc_if_0(coder->is_rep0_long[state][pos_state],
						SEQ_IS_REP0_LONG) {
					rc_update_0(coder->is_rep0_long[
							state][pos_state]);

					update_short_rep(state);

	case SEQ_SHORTREP:
					if (unlikely(dict_put(&dict, dict_get(
							&dict, rep0)))) {
						coder->sequence = SEQ_SHORTREP;
						goto out;
					}

					continue;
				}

				// Repeating more than one byte at
				// distance of rep0.
				rc_update_1(coder->is_rep0_long[
						state][pos_state]);

			} else {
				rc_update_1(coder->is_rep0[state]);

	case SEQ_IS_REP1:
				// The distance is rep1, rep2 or rep3. Once
				// we find out which one of these three, it
				// is stored to rep0 and rep1, rep2 and rep3
				// are updated accordingly.
				rc_if_0(coder->is_rep1[state], SEQ_IS_REP1) {
					uint32_t distance;

					rc_update_0(coder->is_rep1[state]);

					distance = rep1;
					rep1 = rep0;
					rep0 = distance;

				} else {
					rc_update_1(coder->is_rep1[state]);
	case SEQ_IS_REP2:
					rc_if_0(coder->is_rep2[state],
							SEQ_IS_REP2) {
						uint32_t distance;

						rc_update_0(coder->is_rep2[
								state]);

						distance = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;

					} else {
						uint32_t distance;

						rc_update_1(coder->is_rep2[
								state]);

						distance = rep3;
						rep3 = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;
					}
				}
			}

			update_long_rep(state);

			// Decode the length of the repeated match.
			len_decode(len, coder->rep_len_decoder,
					pos_state, SEQ_REP_LEN);
		}

		/////////////////////////////////
		// Repeat from history buffer. //
		/////////////////////////////////

		// The length is always between these limits. There is no way
		// to trigger the algorithm to set len outside this range.
		assert(len >= MATCH_LEN_MIN);
		assert(len <= MATCH_LEN_MAX);

	case SEQ_COPY:
		// Repeat len bytes from distance of rep0.
		if (unlikely(dict_repeat(&dict, rep0, &len))) {
			coder->sequence = SEQ_COPY;
			goto out;
		}
	}

	rc_normalize(SEQ_NORMALIZE);
	coder->sequence = SEQ_IS_MATCH;

out:
	// Save state

	// NOTE: Must not copy dict.limit.
	dictptr->pos = dict.pos;
	dictptr->full = dict.full;

	rc_from_local(coder->rc, *in_pos);

	coder->state = state;
	coder->rep0 = rep0;
	coder->rep1 = rep1;
	coder->rep2 = rep2;
	coder->rep3 = rep3;

	coder->probs = probs;
	coder->symbol = symbol;
	coder->limit = limit;
	coder->offset = offset;
	coder->len = len;

	// Update the remaining amount of uncompressed data if uncompressed
	// size was known.
	if (coder->uncompressed_size != LZMA_VLI_UNKNOWN) {
		coder->uncompressed_size -= dict.pos - dict_start;

		// Since there cannot be end of payload marker if the
		// uncompressed size was known, we check here if we
		// finished decoding.
		if (coder->uncompressed_size == 0 && ret == LZMA_OK
				&& coder->sequence != SEQ_NORMALIZE)
			ret = coder->sequence == SEQ_IS_MATCH
					? LZMA_STREAM_END : LZMA_DATA_ERROR;
	}

	// We can do an additional check in the range decoder to catch some
	// corrupted files.
	if (ret == LZMA_STREAM_END) {
		if (!rc_is_finished(coder->rc))
			ret = LZMA_DATA_ERROR;

		// Reset the range decoder so that it is ready to reinitialize
		// for a new LZMA2 chunk.
		rc_reset(coder->rc);
	}

	return ret;
}